

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# force_ip.cc
# Opt level: O0

void __thiscall
rcdiscover::ForceIP::sendCommand
          (ForceIP *this,uint64_t mac,uint32_t ip,uint32_t subnet,uint32_t gateway)

{
  uint uVar1;
  value_type vVar2;
  bool bVar3;
  reference pvVar4;
  undefined4 in_ECX;
  undefined4 in_EDX;
  void *__buf;
  undefined8 in_RSI;
  int in_R8D;
  NetworkUnreachableException *anon_var_0;
  SocketLinux *socket;
  iterator __end1;
  iterator __begin1;
  vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> *__range1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> force_ip_command;
  vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>
  *in_stack_ffffffffffffff28;
  tuple<unsigned_char_&,_unsigned_char_&> *in_stack_ffffffffffffff30;
  allocator_type *in_stack_ffffffffffffff40;
  undefined6 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  undefined1 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff51;
  undefined1 in_stack_ffffffffffffff52;
  undefined1 in_stack_ffffffffffffff53;
  undefined1 in_stack_ffffffffffffff54;
  undefined1 in_stack_ffffffffffffff55;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 in_stack_ffffffffffffff57;
  uchar local_88 [24];
  reference local_70;
  SocketLinux *local_68;
  __normal_iterator<rcdiscover::SocketLinux_*,_std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>_>
  local_60 [5];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  int local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined8 local_10;
  
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x12782c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffff57,
                      CONCAT16(in_stack_ffffffffffffff56,
                               CONCAT15(in_stack_ffffffffffffff55,
                                        CONCAT14(in_stack_ffffffffffffff54,
                                                 CONCAT13(in_stack_ffffffffffffff53,
                                                          CONCAT12(in_stack_ffffffffffffff52,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff51,
                                                  in_stack_ffffffffffffff50))))))),
             CONCAT17(in_stack_ffffffffffffff4f,
                      CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)),
             in_stack_ffffffffffffff40);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x127852);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,0);
  *pvVar4 = 'B';
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,1);
  *pvVar4 = '\0';
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,2);
  *pvVar4 = '\0';
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,3);
  *pvVar4 = '\x04';
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,4);
  *pvVar4 = '\0';
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,5);
  *pvVar4 = '8';
  vVar2 = (value_type)((ulong)local_10 >> 0x28);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,10);
  *pvVar4 = vVar2;
  vVar2 = (value_type)((ulong)local_10 >> 0x20);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,0xb);
  *pvVar4 = vVar2;
  vVar2 = (value_type)((ulong)local_10 >> 0x18);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,0xc);
  *pvVar4 = vVar2;
  vVar2 = (value_type)((ulong)local_10 >> 0x10);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,0xd);
  *pvVar4 = vVar2;
  vVar2 = (value_type)((ulong)local_10 >> 8);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,0xe);
  *pvVar4 = vVar2;
  vVar2 = (value_type)local_10;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,0xf);
  *pvVar4 = vVar2;
  vVar2 = (value_type)((uint)local_14 >> 0x18);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,0x1c);
  *pvVar4 = vVar2;
  vVar2 = (value_type)((uint)local_14 >> 0x10);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,0x1d);
  *pvVar4 = vVar2;
  vVar2 = (value_type)((uint)local_14 >> 8);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,0x1e);
  *pvVar4 = vVar2;
  vVar2 = (value_type)local_14;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,0x1f);
  *pvVar4 = vVar2;
  uVar1 = (uint)local_18 >> 0x18;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,0x2c);
  *pvVar4 = (value_type)uVar1;
  uVar1 = (uint)local_18 >> 0x10;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,0x2d);
  *pvVar4 = (value_type)uVar1;
  uVar1 = (uint)local_18 >> 8;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,0x2e);
  *pvVar4 = (value_type)uVar1;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,0x2f);
  *pvVar4 = (value_type)local_18;
  uVar1 = (uint)local_1c >> 0x18;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,0x3c);
  *pvVar4 = (value_type)uVar1;
  uVar1 = (uint)local_1c >> 0x10;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,0x3d);
  *pvVar4 = (value_type)uVar1;
  uVar1 = (uint)local_1c >> 8;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,0x3e);
  *pvVar4 = (value_type)uVar1;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,0x3f);
  *pvVar4 = (value_type)local_1c;
  local_60[0]._M_current =
       (SocketLinux *)
       std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>::begin
                 (in_stack_ffffffffffffff28);
  local_68 = (SocketLinux *)
             std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>::end
                       (in_stack_ffffffffffffff28);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<rcdiscover::SocketLinux_*,_std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>_>
                        *)in_stack_ffffffffffffff30,
                       (__normal_iterator<rcdiscover::SocketLinux_*,_std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>_>
                        *)in_stack_ffffffffffffff28);
    if (!bVar3) break;
    local_70 = __gnu_cxx::
               __normal_iterator<rcdiscover::SocketLinux_*,_std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>_>
               ::operator*(local_60);
    GigERequestCounter::getNext();
    in_stack_ffffffffffffff40 = (allocator_type *)&local_38;
    in_stack_ffffffffffffff30 =
         (tuple<unsigned_char_&,_unsigned_char_&> *)
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_ffffffffffffff40,6);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff40,7)
    ;
    std::tie<unsigned_char,unsigned_char>(local_88,(uchar *)in_stack_ffffffffffffff30);
    std::tuple<unsigned_char&,unsigned_char&>::operator=
              (in_stack_ffffffffffffff30,
               (tuple<unsigned_char,_unsigned_char> *)in_stack_ffffffffffffff28);
    Socket<rcdiscover::SocketLinux>::send
              (&local_70->super_Socket<rcdiscover::SocketLinux>,(int)in_stack_ffffffffffffff40,__buf
               ,(size_t)pvVar4,in_R8D);
    __gnu_cxx::
    __normal_iterator<rcdiscover::SocketLinux_*,_std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>_>
    ::operator++(local_60);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff40);
  return;
}

Assistant:

void ForceIP::sendCommand(const uint64_t mac, const uint32_t ip,
                          const uint32_t subnet, const uint32_t gateway)
{
  std::vector<std::uint8_t> force_ip_command(64);
  force_ip_command[0] = 0x42;
  force_ip_command[1] = 0x00;   // flags
  force_ip_command[2] = 0x00;   // command: FORCEIP_CMD: 0x0004
  force_ip_command[3] = 0x04;   // command: FORCEIP_CMD: 0x0004
  force_ip_command[4] = 0x00;   // length
  force_ip_command[5] = 64 - 8; // length

  force_ip_command[10] = static_cast<std::uint8_t>(mac >> 40); // MAC address
  force_ip_command[11] = static_cast<std::uint8_t>(mac >> 32); // MAC address
  force_ip_command[12] = static_cast<std::uint8_t>(mac >> 24); // MAC address
  force_ip_command[13] = static_cast<std::uint8_t>(mac >> 16); // MAC address
  force_ip_command[14] = static_cast<std::uint8_t>(mac >> 8);  // MAC address
  force_ip_command[15] = static_cast<std::uint8_t>(mac >> 0);  // MAC address

  force_ip_command[28] = static_cast<std::uint8_t>(ip >> 24); // IP address
  force_ip_command[29] = static_cast<std::uint8_t>(ip >> 16); // IP address
  force_ip_command[30] = static_cast<std::uint8_t>(ip >> 8);  // IP address
  force_ip_command[31] = static_cast<std::uint8_t>(ip >> 0);  // IP address

  force_ip_command[44] = static_cast<std::uint8_t>(subnet >> 24); // subnet
  force_ip_command[45] = static_cast<std::uint8_t>(subnet >> 16); // subnet
  force_ip_command[46] = static_cast<std::uint8_t>(subnet >> 8);  // subnet
  force_ip_command[47] = static_cast<std::uint8_t>(subnet >> 0);  // subnet

  force_ip_command[60] = static_cast<std::uint8_t>(gateway >> 24); // gateway
  force_ip_command[61] = static_cast<std::uint8_t>(gateway >> 16); // gateway
  force_ip_command[62] = static_cast<std::uint8_t>(gateway >> 8);  // gateway
  force_ip_command[63] = static_cast<std::uint8_t>(gateway >> 0);  // gateway

  for (auto &socket : sockets_)
  {
    std::tie(force_ip_command[6], force_ip_command[7]) =
        GigERequestCounter::getNext();

    try
    {
      socket.send(force_ip_command);
    }
    catch(const NetworkUnreachableException &)
    {
      continue;
    }
  }
}